

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O1

Array<unsigned_char> *
kj::anon_unknown_65::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  RemoveConst<kj::Array<unsigned_char>_> *pRVar1;
  Array<unsigned_char> *pAVar2;
  Fault FVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  undefined4 extraout_var;
  uchar *puVar7;
  undefined7 in_register_00000009;
  Array<unsigned_char> *p;
  size_t sVar8;
  Array<unsigned_char> *pAVar9;
  Vector<kj::Array<unsigned_char>_> parts;
  Array<unsigned_char> part;
  Fault f_1;
  Vector<kj::Array<unsigned_char>_> local_a8;
  Fault local_88;
  ulong uStack_80;
  ArrayDisposer *local_78;
  undefined4 local_6c;
  Array<unsigned_char> *local_68;
  Fault local_60;
  ulong local_58;
  InputStream *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong __n;
  
  local_a8.builder.ptr = (Array<unsigned_char> *)0x0;
  local_a8.builder.pos = (Array<unsigned_char> *)0x0;
  local_a8.builder.endPtr = (Array<unsigned_char> *)0x0;
  local_6c = (undefined4)CONCAT71(in_register_00000009,nulTerminate);
  local_58 = CONCAT71(in_register_00000009,nulTerminate) & 0xffffffff;
  local_68 = __return_storage_ptr__;
  local_50 = input;
  do {
    if (limit == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26]>
                (&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","\"Reached limit before EOF.\"",
                 (char (*) [26])"Reached limit before EOF.");
      _::Debug::Fault::fatal(&local_88);
    }
    sVar8 = 0x1000;
    if (limit < 0x1000) {
      sVar8 = limit;
    }
    local_88.exception =
         (Exception *)
         _::HeapArrayDisposer::allocateImpl
                   (1,sVar8,sVar8,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
    local_78 = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    uStack_80 = sVar8;
    iVar6 = (*local_50->_vptr_InputStream[2])(local_50,local_88.exception,sVar8);
    uVar4 = uStack_80;
    __n = CONCAT44(extraout_var,iVar6);
    if (__n < uStack_80) {
      sVar8 = ((ulong)((long)local_a8.builder.pos - (long)local_a8.builder.ptr) >> 3) *
              -0x5555555555555000 + local_58 + __n;
      puVar7 = (uchar *)_::HeapArrayDisposer::allocateImpl
                                  (1,sVar8,sVar8,(_func_void_void_ptr *)0x0,
                                   (_func_void_void_ptr *)0x0);
      pRVar1 = local_a8.builder.pos;
      __return_storage_ptr__->ptr = puVar7;
      __return_storage_ptr__->size_ = sVar8;
      __return_storage_ptr__->disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
      for (pAVar9 = local_a8.builder.ptr; pAVar9 != pRVar1; pAVar9 = pAVar9 + 1) {
        memcpy(puVar7,pAVar9->ptr,0x1000);
        puVar7 = puVar7 + 0x1000;
      }
      memcpy(puVar7,local_88.exception,__n);
      puVar7 = puVar7 + __n;
      if ((char)local_6c != '\0') {
        *puVar7 = '\0';
        puVar7 = puVar7 + 1;
      }
      __return_storage_ptr__ = local_68;
      if (puVar7 != local_68->ptr + local_68->size_) {
        local_60.exception = (Exception *)0x0;
        local_48 = 0;
        uStack_40 = 0;
        _::Debug::Fault::init
                  (&local_60,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
                  );
        _::Debug::Fault::fatal(&local_60);
      }
    }
    else {
      if (local_a8.builder.pos == local_a8.builder.endPtr) {
        sVar8 = ((long)local_a8.builder.endPtr - (long)local_a8.builder.ptr >> 3) *
                0x5555555555555556;
        if (local_a8.builder.endPtr == local_a8.builder.ptr) {
          sVar8 = 4;
        }
        Vector<kj::Array<unsigned_char>_>::setCapacity(&local_a8,sVar8);
      }
      (local_a8.builder.pos)->ptr = (uchar *)local_88.exception;
      (local_a8.builder.pos)->size_ = uStack_80;
      (local_a8.builder.pos)->disposer = local_78;
      local_88.exception = (Exception *)0x0;
      uStack_80 = 0;
      local_a8.builder.pos = local_a8.builder.pos + 1;
    }
    uVar5 = uStack_80;
    FVar3.exception = local_88.exception;
    if (local_88.exception != (Exception *)0x0) {
      local_88.exception = (Exception *)0x0;
      uStack_80 = 0;
      (*(code *)**(undefined8 **)local_78)(local_78,FVar3.exception,1,uVar5,uVar5,0);
    }
    pAVar2 = local_a8.builder.endPtr;
    pRVar1 = local_a8.builder.pos;
    pAVar9 = local_a8.builder.ptr;
    limit = limit - __n;
    if (__n < uVar4) {
      if (local_a8.builder.ptr != (Array<unsigned_char> *)0x0) {
        local_a8.builder.ptr = (Array<unsigned_char> *)0x0;
        local_a8.builder.pos = (RemoveConst<kj::Array<unsigned_char>_> *)0x0;
        local_a8.builder.endPtr = (Array<unsigned_char> *)0x0;
        (*(code *)**(undefined8 **)local_a8.builder.disposer)
                  (local_a8.builder.disposer,pAVar9,0x18,
                   ((long)pRVar1 - (long)pAVar9 >> 3) * -0x5555555555555555,
                   ((long)pAVar2 - (long)pAVar9 >> 3) * -0x5555555555555555,
                   ArrayDisposer::Dispose_<kj::Array<unsigned_char>,_false>::destruct);
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part.begin(), part.size(), part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}